

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O0

deFloat16 deFloat32To16(float val32)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  deUint32 b;
  deUint32 a;
  deUint32 t;
  anon_union_4_2_947300b0 x;
  deUint32 mantissa;
  int expotent;
  deUint32 sign;
  float val32_local;
  
  sign._2_2_ = (ushort)((uint)val32 >> 0x10) & 0x8000;
  uVar2 = (uint)val32 >> 0x17 & 0xff;
  x.u = uVar2 - 0x70;
  uVar3 = (uint)val32 & 0x7fffff;
  if ((int)x < 1) {
    if (-0xb < (int)x.u) {
      bVar1 = -(char)x.u + 0xe;
      sign._2_2_ = sign._2_2_ |
                   (ushort)((uVar3 | 0x800000) + (1 << (-(char)x.u + 0xdU & 0x1f)) + -1 +
                            ((uVar3 | 0x800000) >> (bVar1 & 0x1f) & 1) >> (bVar1 & 0x1f));
    }
  }
  else if (x.u == 0x8f) {
    if (uVar3 == 0) {
      sign._2_2_ = sign._2_2_ | 0x7c00;
    }
    else {
      sign._2_2_ = sign._2_2_ | 0x7c00 | (ushort)(uVar3 >> 0xd) | (ushort)(uVar3 >> 0xd == 0);
    }
  }
  else {
    t = uVar3 + 0xfff + (uVar3 >> 0xd & 1);
    if ((t & 0x800000) != 0) {
      t = 0;
      x.u = uVar2 - 0x6f;
    }
    if ((int)x.u < 0x1f) {
      sign._2_2_ = sign._2_2_ | (ushort)(x.u << 10) | (ushort)(t >> 0xd);
    }
    else {
      sign._2_2_ = sign._2_2_ | 0x7c00;
    }
  }
  return sign._2_2_;
}

Assistant:

DE_BEGIN_EXTERN_C

deFloat16 deFloat32To16 (float val32)
{
	deUint32	sign;
	int			expotent;
	deUint32	mantissa;
	union
	{
		float		f;
		deUint32	u;
	} x;

	x.f			= val32;
	sign		= (x.u >> 16u) & 0x00008000u;
	expotent	= (int)((x.u >> 23u) & 0x000000ffu) - (127 - 15);
	mantissa	= x.u & 0x007fffffu;

	if (expotent <= 0)
	{
		if (expotent < -10)
		{
			/* Rounds to zero. */
			return (deFloat16) sign;
		}

		/* Converted to denormalized half, add leading 1 to significand. */
		mantissa = mantissa | 0x00800000u;

		/* Round mantissa to nearest (10+e) */
		{
			deUint32 t = 14u - expotent;
			deUint32 a = (1u << (t - 1u)) - 1u;
			deUint32 b = (mantissa >> t) & 1u;

			mantissa = (mantissa + a + b) >> t;
		}

		return (deFloat16) (sign | mantissa);
	}
	else if (expotent == 0xff - (127 - 15))
	{
		if (mantissa == 0u)
		{
			/* InF */
			return (deFloat16) (sign | 0x7c00u);
		}
		else
		{
			/* NaN */
			mantissa >>= 13u;
			return (deFloat16) (sign | 0x7c00u | mantissa | (mantissa == 0u));
		}
	}
	else
	{
		/* Normalized float. */
		mantissa = mantissa + 0x00000fffu + ((mantissa >> 13u) & 1u);

		if (mantissa & 0x00800000u)
		{
			/* Overflow in mantissa. */
			mantissa  = 0u;
			expotent += 1;
		}

		if (expotent > 30)
		{
			/* \todo [pyry] Cause hw fp overflow */
			return (deFloat16) (sign | 0x7c00u);
		}

		return (deFloat16) (sign | ((deUint32)expotent << 10u) | (mantissa >> 13u));
	}
}